

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O2

QRegion __thiscall QDockAreaLayout::separatorRegion(QDockAreaLayout *this)

{
  bool bVar1;
  QDockAreaLayout *in_RSI;
  int i;
  long lVar2;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QRect local_50;
  QRegion local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)this->corners = &DAT_aaaaaaaaaaaaaaaa;
  QRegion::QRegion((QRegion *)this);
  this_00 = in_RSI->docks;
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    bVar1 = QDockAreaLayoutInfo::isEmpty(this_00);
    if (!bVar1) {
      local_50 = separatorRect(in_RSI,(int)lVar2);
      QRegion::QRegion(&local_40,&local_50,Rectangle);
      QRegion::operator|=((QRegion *)this,&local_40);
      QRegion::~QRegion(&local_40);
      QDockAreaLayoutInfo::separatorRegion((QDockAreaLayoutInfo *)&local_50);
      QRegion::operator|=((QRegion *)this,(QRegion *)&local_50);
      QRegion::~QRegion((QRegion *)&local_50);
    }
    this_00 = this_00 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QRegion)(QRegionData *)this;
  }
  __stack_chk_fail();
}

Assistant:

QRegion QDockAreaLayout::separatorRegion() const
{
    QRegion result;

    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QDockAreaLayoutInfo &dock = docks[i];
        if (dock.isEmpty())
            continue;
        result |= separatorRect(i);
        result |= dock.separatorRegion();
    }

    return result;
}